

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O2

string * __thiscall
hanabi_learning_env::HanabiState::ToString_abi_cxx11_
          (string *__return_storage_ptr__,HanabiState *this)

{
  pointer pHVar1;
  int i_1;
  ulong uVar2;
  int i;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::to_string(&local_50,this->life_tokens_);
  std::operator+(&local_70,"Life tokens: ",&local_50);
  std::operator+(&local_90,&local_70,"\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::to_string(&local_50,this->information_tokens_);
  std::operator+(&local_70,"Info tokens: ",&local_50);
  std::operator+(&local_90,&local_70,"\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  for (lVar3 = 0; lVar3 < this->parent_game_->num_colors_; lVar3 = lVar3 + 1) {
    ColorIndexToChar((int)lVar3);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::__cxx11::to_string
              (&local_70,
               (this->fireworks_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar3]);
    std::operator+(&local_90,&local_70," ");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  lVar3 = 0;
  for (uVar2 = 0;
      uVar2 < (ulong)(((long)(this->hands_).
                             super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->hands_).
                            super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x30); uVar2 = uVar2 + 1) {
    if (lVar3 != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if (uVar2 == (uint)this->cur_player_) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    HanabiHand::ToString_abi_cxx11_
              (&local_90,
               (HanabiHand *)
               ((long)&(((this->hands_).
                         super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                         ._M_impl.super__Vector_impl_data._M_start)->cards_).
                       super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                       ._M_impl + lVar3));
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_90);
    lVar3 = lVar3 + 0x30;
  }
  std::__cxx11::to_string(&local_50,(this->deck_).total_count_);
  std::operator+(&local_70,"Deck size: ",&local_50);
  std::operator+(&local_90,&local_70,"\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  lVar3 = 0;
  for (uVar2 = 0;
      pHVar1 = (this->discard_pile_).
               super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->discard_pile_).
                            super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar1 >> 3);
      uVar2 = uVar2 + 1) {
    HanabiCard::ToString_abi_cxx11_(&local_70,(HanabiCard *)((long)&pHVar1->color_ + lVar3));
    std::operator+(&local_90," ",&local_70);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    lVar3 = lVar3 + 8;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HanabiState::ToString() const {
  std::string result;
  result += "Life tokens: " + std::to_string(LifeTokens()) + "\n";
  result += "Info tokens: " + std::to_string(InformationTokens()) + "\n";
  result += "Fireworks: ";
  for (int i = 0; i < ParentGame()->NumColors(); ++i) {
    result += ColorIndexToChar(i);
    result += std::to_string(fireworks_[i]) + " ";
  }
  result += "\nHands:\n";
  for (int i = 0; i < hands_.size(); ++i) {
    if (i > 0) {
      result += "-----\n";
    }
    if (i == CurPlayer()) {
      result += "Cur player\n";
    }
    result += hands_[i].ToString();
  }
  result += "Deck size: " + std::to_string(Deck().Size()) + "\n";
  result += "Discards:";
  for (int i = 0; i < discard_pile_.size(); ++i) {
    result += " " + discard_pile_[i].ToString();
  }
  return result;
}